

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

void __thiscall fasttext::Dictionary::add(Dictionary *this,string *w)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int64_t *piVar2;
  int iVar3;
  int32_t iVar4;
  long lVar5;
  entry e;
  value_type local_70;
  
  iVar4 = find(this,w);
  this->ntokens_ = this->ntokens_ + 1;
  lVar5 = (long)(this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar4];
  if (lVar5 == -1) {
    paVar1 = &local_70.word.field_2;
    local_70.word._M_string_length = 0;
    local_70.word.field_2._M_local_buf[0] = '\0';
    local_70.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_70.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_70.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_70.word._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_assign((string *)&local_70);
    local_70.count = 1;
    local_70.type = getType(this,w);
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::push_back
              (&this->words_,&local_70);
    iVar3 = this->size_;
    this->size_ = iVar3 + 1;
    (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar4] = iVar3;
    if (local_70.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.word._M_dataplus._M_p != paVar1) {
      operator_delete(local_70.word._M_dataplus._M_p);
    }
  }
  else {
    piVar2 = &(this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar5].count;
    *piVar2 = *piVar2 + 1;
  }
  return;
}

Assistant:

void Dictionary::add(const std::string& w) {
	int32_t h = find(w);
	// std::cerr << w << "=" << h << " ";
	ntokens_++;
	if (word2int_[h] == -1) { //?
		// std::cout << "new " << w << std::endl;
		entry e;
		e.word = w;
		e.count = 1;
		e.type = getType(w);
		words_.push_back(e);
		word2int_[h] = size_++;
	} else {
		words_[word2int_[h]].count++;
	}
}